

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall
kj::_::ImmediateBrokenPromiseNode::ImmediateBrokenPromiseNode
          (ImmediateBrokenPromiseNode *this,Exception *exception)

{
  Context *pCVar1;
  int iVar2;
  Type TVar3;
  
  (this->super_ImmediatePromiseNodeBase).super_PromiseNode._vptr_PromiseNode =
       (_func_int **)&PTR_onReady_00628800;
  (this->exception).ownFile.content.ptr = (exception->ownFile).content.ptr;
  (this->exception).ownFile.content.size_ = (exception->ownFile).content.size_;
  (this->exception).ownFile.content.disposer = (exception->ownFile).content.disposer;
  (exception->ownFile).content.ptr = (char *)0x0;
  (exception->ownFile).content.size_ = 0;
  iVar2 = exception->line;
  TVar3 = exception->type;
  (this->exception).file = exception->file;
  (this->exception).line = iVar2;
  (this->exception).type = TVar3;
  (this->exception).description.content.ptr = (exception->description).content.ptr;
  (this->exception).description.content.size_ = (exception->description).content.size_;
  (this->exception).description.content.disposer = (exception->description).content.disposer;
  (exception->description).content.ptr = (char *)0x0;
  (exception->description).content.size_ = 0;
  pCVar1 = (exception->context).ptr.ptr;
  (this->exception).context.ptr.disposer = (exception->context).ptr.disposer;
  (this->exception).context.ptr.ptr = pCVar1;
  (exception->context).ptr.ptr = (Context *)0x0;
  memcpy((this->exception).trace,exception->trace,0x104);
  return;
}

Assistant:

ImmediateBrokenPromiseNode::ImmediateBrokenPromiseNode(Exception&& exception)
    : exception(kj::mv(exception)) {}